

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O2

bool __thiscall Hpipe::CharItem::apply_rec(CharItem *this,function<bool_(Hpipe::CharItem_*)> *f)

{
  pointer pCVar1;
  CharItem *this_00;
  bool bVar2;
  bool bVar3;
  pointer pCVar4;
  function<bool_(Hpipe::CharItem_*)> local_50;
  
  bVar2 = true;
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    bVar2 = std::function<bool_(Hpipe::CharItem_*)>::operator()(f,this);
    if (bVar2) {
      pCVar1 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar2 = true;
      for (pCVar4 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                    super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
        this_00 = pCVar4->item;
        std::function<bool_(Hpipe::CharItem_*)>::function(&local_50,f);
        bVar3 = apply_rec(this_00,&local_50);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
        bVar2 = (bool)(bVar2 & bVar3);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool CharItem::apply_rec( std::function<bool( CharItem * )> f ) {
    if ( op_id == CharItem::cur_op_id )
        return true;
    op_id = CharItem::cur_op_id;

    if ( not f( this ) )
        return false;

    bool res = true;
    for( CharEdge &t : edges )
        if ( not t.item->apply_rec( f ) )
            res = false;
    return res;
}